

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t canGzip(void)

{
  wchar_t wVar1;
  
  if (canGzip_tested == '\0') {
    canGzip_tested = '\x01';
    wVar1 = systemf("gzip --help %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canGzip_value = 1;
    }
  }
  return (uint)canGzip_value;
}

Assistant:

int
canGzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("gzip --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}